

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

void __thiscall
soul::ResolutionPass::rebuildVariableUseCounts(soul::AST::ModuleBase&)::UseCounter::visit(soul::AST
::Assignment__(void *this,Assignment *a)

{
  byte bVar1;
  byte bVar2;
  Expression *pEVar3;
  bool oldReading;
  bool oldWriting;
  Assignment *a_local;
  UseCounter *this_local;
  
  bVar1 = *(byte *)((long)this + 9);
  bVar2 = *(byte *)((long)this + 8);
  *(undefined1 *)((long)this + 8) = 0;
  *(undefined1 *)((long)this + 9) = 1;
  pEVar3 = pool_ref::operator_cast_to_Expression_((pool_ref *)&a->target);
  (**(code **)(*this + 0x18))(this,pEVar3);
  *(byte *)((long)this + 9) = bVar1 & 1;
  *(byte *)((long)this + 8) = bVar2 & 1;
  pEVar3 = pool_ref::operator_cast_to_Expression_((pool_ref *)&a->newValue);
  (**(code **)(*this + 0x18))(this,pEVar3);
  return;
}

Assistant:

void visit (AST::Assignment& a) override
            {
                auto oldWriting = isWriting;
                auto oldReading = isReading;
                isReading = false;
                isWriting = true;
                visitObject (a.target);
                isWriting = oldWriting;
                isReading = oldReading;
                visitObject (a.newValue);
            }